

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_reporter.h
# Opt level: O1

void __thiscall
phyr::Timer::TimerLoop<phyr::ProgressReporter::RefreshFunctor>::operator()
          (TimerLoop<phyr::ProgressReporter::RefreshFunctor> *this,
          unique_ptr<phyr::ProgressReporter::RefreshFunctor,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
          *f,int delay)

{
  TimerState TVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  Timer *pTVar5;
  pthread_mutex_t *__mutex;
  long lVar6;
  timespec local_40;
  
  pTVar5 = this->timer;
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar6 = (pTVar5->startTime).__d.__r;
  pTVar5 = this->timer;
  __mutex = (pthread_mutex_t *)&pTVar5->mutex;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    lVar6 = (lVar3 - lVar6) / 1000000;
    do {
      TVar1 = pTVar5->state;
      pthread_mutex_unlock(__mutex);
      if (TVar1 != ACTIVE) {
        return;
      }
      pTVar5 = this->timer;
      lVar3 = std::chrono::_V2::system_clock::now();
      lVar3 = (lVar3 - (pTVar5->startTime).__d.__r) / 1000000;
      if ((ulong)(long)delay <= (ulong)(lVar3 - lVar6)) {
        ProgressReporter::showProgress
                  (((f->_M_t).
                    super___uniq_ptr_impl<phyr::ProgressReporter::RefreshFunctor,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_phyr::ProgressReporter::RefreshFunctor_*,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
                    .super__Head_base<0UL,_phyr::ProgressReporter::RefreshFunctor_*,_false>.
                   _M_head_impl)->reporter);
        lVar6 = lVar3;
      }
      local_40.tv_sec = 0;
      local_40.tv_nsec = 20000000;
      do {
        iVar2 = nanosleep(&local_40,&local_40);
        if (iVar2 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      pTVar5 = this->timer;
      __mutex = (pthread_mutex_t *)&pTVar5->mutex;
      iVar2 = pthread_mutex_lock(__mutex);
    } while (iVar2 == 0);
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void operator()(std::unique_ptr<Functor> f, int delay, Args... args) {
            uint64_t elapsed, delta;
            uint64_t last_call_tstamp = timer->getElapsedTime();

            while (timer->isActive()) {
                elapsed = timer->getElapsedTime();
                delta = elapsed - last_call_tstamp;

                // Check if elapsed time is more than provided delay
                if (delta >= delay) {
                    // Reset {last_call_tstamp}
                    last_call_tstamp = elapsed;
                    // Call the provided functor
                    (*f)(args...);
                }

                // Sleep to allow for context switches
                std::this_thread::sleep_for(std::chrono::milliseconds(20));
            }
        }